

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O2

void __thiscall chrono::ChMarker::UpdatedExternalTime(ChMarker *this,double prevtime,double mtime)

{
  ChCoordsys<double> *other;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_e8;
  double dStack_e0;
  double local_d8;
  ChQuaternion<double> local_d0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_90;
  double dStack_88;
  double dStack_80;
  double dStack_78;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  local_d8 = 0.0;
  local_98 = 0.0;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  local_d0.m_data[0] = 1.0;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  local_90 = 1.0;
  local_d0.m_data[1] = 0.0;
  local_d0.m_data[2] = 0.0;
  local_d0.m_data[3] = 0.0;
  dStack_88 = 0.0;
  dStack_80 = 0.0;
  dStack_78 = 0.0;
  if (this->motion_type != M_MOTION_EXTERNAL) {
    this->motion_type = M_MOTION_FUNCTIONS;
    other = &(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord;
    bVar3 = ChVector<double>::operator==(&other->pos,&(this->last_rel_coord).pos);
    if ((!bVar3) ||
       (bVar3 = Qequal(&(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot,
                       &(this->last_rel_coord).rot), !bVar3)) {
      dVar9 = mtime - prevtime;
      if (((dVar9 != 0.0) || (NAN(dVar9))) &&
         (auVar1._8_8_ = 0, auVar1._0_8_ = dVar9, auVar5._8_8_ = 0x7fffffffffffffff,
         auVar5._0_8_ = 0x7fffffffffffffff, auVar5 = vandpd_avx512vl(auVar1,auVar5),
         auVar5._0_8_ < 0.1)) {
        dVar6 = mtime;
        (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_ChFunction[4])();
        if ((dVar6 == 0.0) && (!NAN(dVar6))) {
          dVar6 = mtime;
          (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          if ((dVar6 == 0.0) && (!NAN(dVar6))) {
            dVar6 = mtime;
            (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ChFunction[4])();
            if ((dVar6 == 0.0) && (!NAN(dVar6))) {
              (*((this->motion_ang).
                 super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_ChFunction[4])();
              if ((mtime == 0.0) &&
                 ((((!NAN(mtime) &&
                    (iVar4 = (*((this->motion_X).
                                super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->_vptr_ChFunction[3])(), iVar4 == 1)) &&
                   (iVar4 = (*((this->motion_Y).
                               super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_ChFunction[3])(), iVar4 == 1)) &&
                  ((iVar4 = (*((this->motion_Z).
                               super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_ChFunction[3])(), iVar4 == 1 &&
                   (iVar4 = (*((this->motion_ang).
                               super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_ChFunction[3])(), iVar4 == 1)))))) {
                dVar9 = 1.0 / dVar9;
                dVar6 = dVar9 * ((this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos
                                 .m_data[2] - (this->last_rel_coord).pos.m_data[2]);
                auVar5 = vsubpd_avx(*(undefined1 (*) [16])
                                     (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord
                                     .pos.m_data,
                                    *(undefined1 (*) [16])(this->last_rel_coord).pos.m_data);
                dVar7 = dVar9 * auVar5._0_8_;
                dVar8 = dVar9 * auVar5._8_8_;
                local_e8 = dVar7;
                dStack_e0 = dVar8;
                local_d8 = dVar6;
                Qsub(&(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot,
                     &(this->last_rel_coord).rot);
                Qscale(&local_50,&local_70,dVar9);
                auVar2._8_8_ = dVar8;
                auVar2._0_8_ = dVar7;
                local_d0.m_data[0] = local_50.m_data[0];
                local_d0.m_data[1] = local_50.m_data[1];
                local_d0.m_data[2] = local_50.m_data[2];
                local_d0.m_data[3] = local_50.m_data[3];
                auVar5 = vsubpd_avx(auVar2,*(undefined1 (*) [16])
                                            (this->last_rel_coord_dt).pos.m_data);
                local_a8 = auVar5._0_8_ * dVar9;
                dStack_a0 = auVar5._8_8_ * dVar9;
                local_98 = (dVar6 - (this->last_rel_coord_dt).pos.m_data[2]) * dVar9;
                Qsub(&local_d0,&(this->last_rel_coord_dt).rot);
                Qscale(&local_50,&local_70,dVar9);
                local_90 = local_50.m_data[0];
                dStack_88 = local_50.m_data[1];
                dStack_80 = local_50.m_data[2];
                dStack_78 = local_50.m_data[3];
                (*(this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[6])
                          (&this->super_ChFrameMoving<double>,&local_e8);
                (*(this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0xb])
                          (&this->super_ChFrameMoving<double>,&local_a8);
                UpdateState(this);
                this->motion_type = M_MOTION_KEYFRAMED;
              }
            }
          }
        }
      }
    }
    this->last_time = (this->super_ChObj).ChTime;
    ChCoordsys<double>::operator=(&this->last_rel_coord,other);
    ChCoordsys<double>::operator=
              (&this->last_rel_coord_dt,&(this->super_ChFrameMoving<double>).coord_dt);
    return;
  }
  return;
}

Assistant:

void ChMarker::UpdatedExternalTime(double prevtime, double mtime) {
    double mstep = mtime - prevtime;

    Coordsys m_rel_pos_dt;
    Coordsys m_rel_pos_dtdt;

    // do not try to switch on the M_MOTION_KEYFRAMED mode if
    // we are already in the M_MOTION_EXTERNAL mode, maybe because
    // a link point-surface is already moving the marker and
    // it will handle the accelerations by itself
    if (this->motion_type == M_MOTION_EXTERNAL)
        return;

    // otherwise see if a BDF is needed, cause an external 3rd party is moving the marker
    this->motion_type = M_MOTION_FUNCTIONS;

    // if POSITION or ROTATION ("rel_pos") has been changed in acceptable time step...
    if ((!(Vequal(coord.pos, last_rel_coord.pos)) || !(Qequal(coord.rot, last_rel_coord.rot))) && (fabs(mstep) < 0.1) &&
        (mstep != 0)) {
        // ... and if motion wasn't caused by motion laws, then it was a keyframed movement!
        if ((motion_X->Get_y(mtime) == 0) && (motion_Y->Get_y(mtime) == 0) && (motion_Z->Get_y(mtime) == 0) &&
            (motion_ang->Get_y(mtime) == 0) && (motion_X->Get_Type() == ChFunction::FUNCT_CONST) &&
            (motion_Y->Get_Type() == ChFunction::FUNCT_CONST) && (motion_Z->Get_Type() == ChFunction::FUNCT_CONST) &&
            (motion_ang->Get_Type() == ChFunction::FUNCT_CONST)) {
            // compute the relative speed by BDF !
            m_rel_pos_dt.pos = Vmul(Vsub(coord.pos, last_rel_coord.pos), 1 / mstep);
            m_rel_pos_dt.rot = Qscale(Qsub(coord.rot, last_rel_coord.rot), 1 / mstep);

            // compute the relative acceleration by BDF !
            m_rel_pos_dtdt.pos = Vmul(Vsub(m_rel_pos_dt.pos, last_rel_coord_dt.pos), 1 / mstep);
            m_rel_pos_dtdt.rot = Qscale(Qsub(m_rel_pos_dt.rot, last_rel_coord_dt.rot), 1 / mstep);

            // Set the position, speed and acceleration in relative space,
            // automatically getting also the absolute values,
            SetCoord_dt(m_rel_pos_dt);
            SetCoord_dtdt(m_rel_pos_dtdt);

            // update the remaining state variables
            this->UpdateState();

            // remember that the movement of this guy won't need further update
            // of speed and acc. via motion laws!
            this->motion_type = M_MOTION_KEYFRAMED;
        }
    }

    // restore state buffers and that's all.
    last_time = ChTime;
    last_rel_coord = coord;
    last_rel_coord_dt = coord_dt;
}